

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DoWhileStatementSyntax::setChild
          (DoWhileStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004b4d24 + *(int *)(&DAT_004b4d24 + index * 4)))();
  return;
}

Assistant:

void DoWhileStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: doKeyword = child.token(); return;
        case 3: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        case 4: whileKeyword = child.token(); return;
        case 5: openParen = child.token(); return;
        case 6: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 7: closeParen = child.token(); return;
        case 8: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}